

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O0

vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_> *
testinator::Arbitrary<std::tuple<int,_float>_>::shrink
          (vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>
           *__return_storage_ptr__,tuple<int,_float> *t)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int,_float>_> *p_Var2;
  tuple<float> *ptVar3;
  value_type local_c0;
  reference local_b8;
  tuple<float> *e_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> *__range2_1;
  undefined1 local_90 [8];
  vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> tail_v;
  undefined1 local_64 [12];
  tuple<float> *local_58;
  int *e;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> head_v;
  tuple<int,_float> *t_local;
  vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_> *ret;
  
  head_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  ::std::vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>::vector
            (__return_storage_ptr__);
  p_Var2 = ::std::get<0ul,int,float>(t);
  detail::Arbitrary_Arithmetic<int>::shrink((vector<int,_std::allocator<int>_> *)&__range2,p_Var2);
  __end0 = ::std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range2);
  e = (int *)::std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &e);
    if (!bVar1) break;
    ptVar3 = (tuple<float> *)
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end0);
    local_58 = ptVar3;
    tuple_tail<std::tuple<int,float>const&>((tuple<int,_float> *)local_64,t);
    tuple_cons<int,std::tuple<float>>((int *)(local_64 + 4),ptVar3,local_64);
    ::std::vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>::push_back
              (__return_storage_ptr__,(value_type *)(local_64 + 4));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  tuple_tail<std::tuple<int,float>const&>((tuple<int,_float> *)((long)&__range2_1 + 4),t);
  Arbitrary<std::tuple<float>_>::shrink
            ((vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> *)local_90,
             (tuple<float> *)((long)&__range2_1 + 4));
  __end0_1 = ::std::vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_>::begin
                       ((vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> *)local_90);
  e_1 = (tuple<float> *)
        ::std::vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_>::end
                  ((vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> *)local_90);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<std::tuple<float>_*,_std::vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_>_>
                        *)&e_1);
    if (!bVar1) break;
    local_b8 = __gnu_cxx::
               __normal_iterator<std::tuple<float>_*,_std::vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_>_>
               ::operator*(&__end0_1);
    ptVar3 = (tuple<float> *)::std::get<0ul,int,float>(t);
    tuple_cons<int_const&,std::tuple<float>>((int *)&local_c0,ptVar3,local_b8);
    ::std::vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>::push_back
              (__return_storage_ptr__,&local_c0);
    __gnu_cxx::
    __normal_iterator<std::tuple<float>_*,_std::vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_>_>
    ::operator++(&__end0_1);
  }
  head_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  ::std::vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_>::~vector
            ((vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> *)local_90);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
  if ((head_v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) == 0) {
    ::std::vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::tuple<Ts...>> shrink(const std::tuple<Ts...>& t)
    {
      std::vector<std::tuple<Ts...>> ret{};

      // shrink the head
      using H = std::decay_t<decltype(std::get<0>(t))>;
      auto head_v = Arbitrary<H>::shrink(std::get<0>(t));
      for (auto& e : head_v)
      {
        ret.push_back(tuple_cons(std::move(e), tuple_tail(t)));
      }

      // shrink the tail recursively
      using T = std::decay_t<decltype(tuple_tail(t))>;
      auto tail_v = Arbitrary<T>::shrink(tuple_tail(t));
      for (auto& e : tail_v)
      {
        ret.push_back(tuple_cons(std::get<0>(t), std::move(e)));
      }

      return ret;
    }